

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

void greetable_proxy_get_property(GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  undefined8 uVar1;
  long lVar2;
  
  if (prop_id != 1) {
    g_assertion_message_expr
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O2/basics_gen.c"
               ,0x27f,"greetable_proxy_get_property","prop_id != 0 && prop_id - 1 < 1");
  }
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(object,uVar1);
  lVar2 = g_dbus_proxy_get_cached_property(uVar1,"Greeting");
  if (lVar2 != 0) {
    g_dbus_gvariant_to_gvalue(lVar2,value);
    g_variant_unref(lVar2);
    return;
  }
  return;
}

Assistant:

static void
greetable_proxy_get_property (GObject      *object,
  guint         prop_id,
  GValue       *value,
  GParamSpec   *pspec G_GNUC_UNUSED)
{
  const _ExtendedGDBusPropertyInfo *info;
  GVariant *variant;
  g_assert (prop_id != 0 && prop_id - 1 < 1);
  info = (const _ExtendedGDBusPropertyInfo *) _greetable_property_info_pointers[prop_id - 1];
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (object), info->parent_struct.name);
  if (info->use_gvariant)
    {
      g_value_set_variant (value, variant);
    }
  else
    {
      if (variant != NULL)
        g_dbus_gvariant_to_gvalue (variant, value);
    }
  if (variant != NULL)
    g_variant_unref (variant);
}